

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# robin_hood.h
# Opt level: O3

pair<unsigned_long,_robin_hood::detail::Table<true,_80UL,_char,_double,_robin_hood::hash<char,_void>,_std::equal_to<char>_>::InsertionState>
 __thiscall
robin_hood::detail::Table<true,80ul,char,double,robin_hood::hash<char,void>,std::equal_to<char>>::
insertKeyPrepareEmptySpot<char_const&>
          (Table<true,80ul,char,double,robin_hood::hash<char,void>,std::equal_to<char>> *this,
          char *key)

{
  byte *pbVar1;
  char cVar2;
  byte bVar3;
  int iVar4;
  bool bVar5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  undefined8 uVar9;
  long lVar10;
  int iVar11;
  char *pcVar12;
  uint uVar13;
  ulong insertion_idx;
  pair<unsigned_long,_robin_hood::detail::Table<true,_80UL,_char,_double,_robin_hood::hash<char,_void>,_std::equal_to<char>_>::InsertionState>
  pVar14;
  
  iVar11 = 0;
  while( true ) {
    cVar2 = *key;
    uVar6 = ((ulong)(long)cVar2 >> 0x21 ^ (long)cVar2) * -0xae502812aa7333;
    uVar6 = (uVar6 >> 0x21 ^ uVar6) * *(long *)this;
    uVar6 = uVar6 >> 0x21 ^ uVar6;
    iVar4 = *(int *)(this + 0x30);
    insertion_idx = uVar6 >> 5 & *(ulong *)(this + 0x20);
    uVar13 = ((uint)uVar6 & 0x1f) >> ((ulong)(byte)this[0x34] & 0x3f);
    lVar7 = *(long *)(this + 0x10);
    bVar3 = *(byte *)(lVar7 + insertion_idx);
    while( true ) {
      uVar13 = uVar13 + iVar4;
      if (bVar3 <= uVar13) break;
      bVar3 = *(byte *)(lVar7 + 1 + insertion_idx);
      insertion_idx = insertion_idx + 1;
    }
    if (uVar13 == bVar3) {
      pcVar12 = (char *)(insertion_idx * 0x10 + *(long *)(this + 8));
      do {
        if (cVar2 == *pcVar12) {
          uVar9 = 1;
          goto LAB_0010f4c7;
        }
        pbVar1 = (byte *)(lVar7 + 1 + insertion_idx);
        uVar13 = uVar13 + iVar4;
        insertion_idx = insertion_idx + 1;
        pcVar12 = pcVar12 + 0x10;
      } while (uVar13 == *pbVar1);
    }
    if (*(ulong *)(this + 0x18) < *(ulong *)(this + 0x28)) break;
    bVar5 = Table<true,_80UL,_char,_double,_robin_hood::hash<char,_void>,_std::equal_to<char>_>::
            increase_size((Table<true,_80UL,_char,_double,_robin_hood::hash<char,_void>,_std::equal_to<char>_>
                           *)this);
    insertion_idx = 0;
    if (!bVar5) {
      uVar9 = 0;
      goto LAB_0010f4c7;
    }
    iVar11 = iVar11 + 1;
    uVar9 = 0;
    if (iVar11 == 0x100) goto LAB_0010f4c7;
  }
  if (0xff < iVar4 + uVar13) {
    *(undefined8 *)(this + 0x28) = 0;
  }
  lVar8 = 1;
  lVar10 = lVar7;
  do {
    lVar8 = lVar8 + -1;
    pcVar12 = (char *)(lVar10 + insertion_idx);
    lVar10 = lVar10 + 1;
  } while (*pcVar12 != '\0');
  if (lVar8 == 0) {
    uVar9 = 2;
  }
  else {
    Table<true,_80UL,_char,_double,_robin_hood::hash<char,_void>,_std::equal_to<char>_>::shiftUp
              ((Table<true,_80UL,_char,_double,_robin_hood::hash<char,_void>,_std::equal_to<char>_>
                *)this,insertion_idx - lVar8,insertion_idx);
    lVar7 = *(long *)(this + 0x10);
    uVar9 = 3;
  }
  *(char *)(lVar7 + insertion_idx) = (char)uVar13;
  *(long *)(this + 0x18) = *(long *)(this + 0x18) + 1;
LAB_0010f4c7:
  pVar14._8_8_ = uVar9;
  pVar14.first = insertion_idx;
  return pVar14;
}

Assistant:

std::pair<size_t, InsertionState> insertKeyPrepareEmptySpot(OtherKey&& key) {
        for (int i = 0; i < 256; ++i) {
            size_t idx{};
            InfoType info{};
            keyToIdx(key, &idx, &info);
            nextWhileLess(&info, &idx);

            // while we potentially have a match
            while (info == mInfo[idx]) {
                if (WKeyEqual::operator()(key, mKeyVals[idx].getFirst())) {
                    // key already exists, do NOT insert.
                    // see http://en.cppreference.com/w/cpp/container/unordered_map/insert
                    return std::make_pair(idx, InsertionState::key_found);
                }
                next(&info, &idx);
            }

            // unlikely that this evaluates to true
            if (ROBIN_HOOD_UNLIKELY(mNumElements >= mMaxNumElementsAllowed)) {
                if (!increase_size()) {
                    return std::make_pair(size_t(0), InsertionState::overflow_error);
                }
                continue;
            }

            // key not found, so we are now exactly where we want to insert it.
            auto const insertion_idx = idx;
            auto const insertion_info = info;
            if (ROBIN_HOOD_UNLIKELY(insertion_info + mInfoInc > 0xFF)) {
                mMaxNumElementsAllowed = 0;
            }

            // find an empty spot
            while (0 != mInfo[idx]) {
                next(&info, &idx);
            }

            if (idx != insertion_idx) {
                shiftUp(idx, insertion_idx);
            }
            // put at empty spot
            mInfo[insertion_idx] = static_cast<uint8_t>(insertion_info);
            ++mNumElements;
            return std::make_pair(insertion_idx, idx == insertion_idx
                                                     ? InsertionState::new_node
                                                     : InsertionState::overwrite_node);
        }

        // enough attempts failed, so finally give up.
        return std::make_pair(size_t(0), InsertionState::overflow_error);
    }